

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  bool bVar1;
  char *pcVar2;
  TestCase *in_RSI;
  String *this_00;
  longlong *in_stack_ffffffffffffffb8;
  char local_40 [8];
  String *in_stack_ffffffffffffffc8;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  bVar1 = TestCase::Passed((TestCase *)0x206ed1);
  TestCase::elapsed_time(in_RSI);
  this_00 = (String *)&stack0xffffffffffffffb0;
  StreamableToString<long_long>(in_stack_ffffffffffffffb8);
  pcVar2 = String::c_str(this_00);
  String::Format(local_40,"event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,pcVar2);
  String::operator_cast_to_string(in_stack_ffffffffffffffc8);
  Send((StreamingListener *)in_RSI,in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  String::~String(this_00);
  String::~String(this_00);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    Send(String::Format("event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                        test_case.Passed(),
                        StreamableToString(test_case.elapsed_time()).c_str()));
  }